

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O1

void __thiscall absl::lts_20250127::log_internal::LogMessage::PrepareToDie(LogMessage *this)

{
  LogMessageData *pLVar1;
  ulong uVar2;
  bool symbolize_stacktrace;
  int max_num_frames;
  LogEntry *entry;
  undefined1 in_R8B;
  Span<absl::lts_20250127::LogSink_*> extra_sinks;
  
  pLVar1 = (this->data_)._M_t.
           super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           ._M_t.
           super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           .
           super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
           ._M_head_impl;
  if (pLVar1->first_fatal == true) {
    AbslInternalOnFatalLogMessage_lts_20250127(&pLVar1->entry);
  }
  pLVar1 = (this->data_)._M_t.
           super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           ._M_t.
           super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           .
           super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
           ._M_head_impl;
  if (pLVar1->fail_quietly != false) {
    return;
  }
  uVar2 = *(ulong *)&(pLVar1->extra_sinks).storage_;
  if ((uVar2 & 1) == 0) {
    entry = (LogEntry *)((long)&(pLVar1->extra_sinks).storage_ + 8);
  }
  else {
    entry = (LogEntry *)
            (((Data *)((long)&(pLVar1->extra_sinks).storage_ + 8))->allocated).allocated_data;
  }
  extra_sinks.ptr_ = uVar2 >> 1;
  extra_sinks.len_._0_1_ = pLVar1->extra_sinks_only;
  extra_sinks.len_._1_7_ = 0;
  LogToSinks((log_internal *)pLVar1,entry,extra_sinks,(bool)in_R8B);
  pLVar1 = (this->data_)._M_t.
           super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           ._M_t.
           super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           .
           super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
           ._M_head_impl;
  std::__cxx11::string::_M_replace
            ((ulong)&(pLVar1->entry).stacktrace_,0,
             *(char **)((long)&(pLVar1->entry).stacktrace_ + 8),0x71581f);
  max_num_frames = MaxFramesInLogStackTrace();
  symbolize_stacktrace = ShouldSymbolizeLogStackTrace();
  debugging_internal::DumpStackTrace
            (0,max_num_frames,symbolize_stacktrace,anon_unknown_4::WriteToString,
             &(((this->data_)._M_t.
                super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                ._M_t.
                super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                .
                super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
               ._M_head_impl)->entry).stacktrace_);
  return;
}

Assistant:

void LogMessage::PrepareToDie() {
  // If we log a FATAL message, flush all the log destinations, then toss
  // a signal for others to catch. We leave the logs in a state that
  // someone else can use them (as long as they flush afterwards)
  if (data_->first_fatal) {
    // Notify observers about the upcoming fatal error.
    ABSL_INTERNAL_C_SYMBOL(AbslInternalOnFatalLogMessage)(data_->entry);
  }

  if (!data_->fail_quietly) {
    // Log the message first before we start collecting stack trace.
    log_internal::LogToSinks(data_->entry, absl::MakeSpan(data_->extra_sinks),
                             data_->extra_sinks_only);

    // `DumpStackTrace` generates an empty string under MSVC.
    // Adding the constant prefix here simplifies testing.
    data_->entry.stacktrace_ = "*** Check failure stack trace: ***\n";
    debugging_internal::DumpStackTrace(
        0, log_internal::MaxFramesInLogStackTrace(),
        log_internal::ShouldSymbolizeLogStackTrace(), WriteToString,
        &data_->entry.stacktrace_);
  }
}